

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatementReader.cpp
# Opt level: O1

uint32 __thiscall
Js::
StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
::MoveNextStatementBoundary
          (StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
           *this)

{
  int *startingAtIndex;
  SmallSpanSequence *pSVar1;
  List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar2;
  byte *pbVar3;
  Type TVar4;
  BOOL BVar5;
  int iVar6;
  Type *ppSVar7;
  StatementMap *pSVar8;
  uint index;
  StatementData local_28;
  StatementData data;
  
  local_28.sourceBegin = 0;
  local_28.bytecodeBegin = 0;
  if (this->m_startOfStatement == true) {
    index = this->m_statementIndex + 1;
    this->m_statementIndex = index;
    pSVar1 = this->m_statementMap;
    if (pSVar1 != (SmallSpanSequence *)0x0) {
      if (pSVar1->pStatementBuffer == (GrowingUint32HeapArray *)0x0) {
        TVar4 = 0;
      }
      else {
        TVar4 = pSVar1->pStatementBuffer->count;
      }
      if ((index < TVar4) &&
         (BVar5 = SmallSpanSequence::Item(pSVar1,index,&this->m_statementMapIter,&local_28),
         BVar5 != 0)) {
LAB_008b3d0f:
        this->m_nextStatementBoundary = this->m_startLocation + local_28.bytecodeBegin;
LAB_008b3d58:
        return this->m_statementIndex;
      }
    }
    pLVar2 = this->m_fullstatementMap;
    if (pLVar2 != (List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   *)0x0) {
      startingAtIndex = &this->m_statementIndex;
      if (*startingAtIndex <
          (pLVar2->
          super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_DefaultComparer>
          ).count) {
        ppSVar7 = JsUtil::
                  List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(pLVar2,*startingAtIndex + -1);
        iVar6 = ((*ppSVar7)->byteCodeSpan).end + 1;
        this->m_nextStatementBoundary = this->m_startLocation + iVar6;
        FunctionBody::
        GetNextNonSubexpressionStatementMap<JsUtil::List<Js::FunctionBody::StatementMap*,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>>
                  (this->m_fullstatementMap,startingAtIndex);
        ppSVar7 = JsUtil::
                  List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(this->m_fullstatementMap,this->m_statementIndex);
        if (iVar6 == ((*ppSVar7)->byteCodeSpan).begin) {
          return *startingAtIndex;
        }
      }
    }
    this->m_startOfStatement = false;
  }
  else {
    this->m_startOfStatement = true;
    pSVar1 = this->m_statementMap;
    if (pSVar1 != (SmallSpanSequence *)0x0) {
      if (pSVar1->pStatementBuffer == (GrowingUint32HeapArray *)0x0) {
        TVar4 = 0;
      }
      else {
        TVar4 = pSVar1->pStatementBuffer->count;
      }
      if (((uint)this->m_statementIndex < TVar4) &&
         (BVar5 = SmallSpanSequence::Item
                            (pSVar1,this->m_statementIndex,&this->m_statementMapIter,&local_28),
         BVar5 != 0)) goto LAB_008b3d0f;
    }
    pLVar2 = this->m_fullstatementMap;
    if ((pLVar2 == (List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    *)0x0) ||
       ((pLVar2->
        super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_DefaultComparer>
        ).count <= this->m_statementIndex)) {
      this->m_nextStatementBoundary = this->m_startLocation + -1;
    }
    else {
      pSVar8 = FunctionBody::
               GetNextNonSubexpressionStatementMap<JsUtil::List<Js::FunctionBody::StatementMap*,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>>
                         (pLVar2,&this->m_statementIndex);
      pbVar3 = this->m_startLocation;
      if (pSVar8 != (StatementMap *)0x0) {
        ppSVar7 = JsUtil::
                  List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(this->m_fullstatementMap,this->m_statementIndex);
        this->m_nextStatementBoundary = pbVar3 + ((*ppSVar7)->byteCodeSpan).begin;
        goto LAB_008b3d58;
      }
      this->m_nextStatementBoundary = pbVar3 + -1;
    }
  }
  return 0xffffffff;
}

Assistant:

uint32 StatementReader<TStatementMapList>::MoveNextStatementBoundary()
    {
        StatementData data;
        uint32 retStatement = Js::Constants::NoStatementIndex;

        if (m_startOfStatement)
        {
            m_statementIndex++;
            if (m_statementMap && (uint32)m_statementIndex < m_statementMap->Count() && m_statementMap->Item(m_statementIndex, m_statementMapIter, data))
            {
                // The end boundary is the last byte of the last instruction in the previous range.
                // We want to track the beginning of the next instruction for AtStatementBoundary.
                m_nextStatementBoundary = m_startLocation + data.bytecodeBegin;

                // The next user statement is adjacent in the bytecode
                retStatement = m_statementIndex;
            }
            else if (m_fullstatementMap && m_statementIndex < m_fullstatementMap->Count())
            {
                int nextInstrStart = m_fullstatementMap->Item(m_statementIndex - 1)->byteCodeSpan.end + 1;
                m_nextStatementBoundary = m_startLocation + nextInstrStart;
                Js::FunctionBody::GetNextNonSubexpressionStatementMap(m_fullstatementMap, m_statementIndex);

                if (nextInstrStart == m_fullstatementMap->Item(m_statementIndex)->byteCodeSpan.begin)
                {
                    retStatement = m_statementIndex;
                }
                else
                {
                    m_startOfStatement = false;
                }
            }
            else
            {
                m_startOfStatement = false;
            }
        }
        else
        {
            m_startOfStatement = true;
            if (m_statementMap && (uint32)m_statementIndex < m_statementMap->Count() && m_statementMap->Item(m_statementIndex, m_statementMapIter, data))
            {
                // Start a range of bytecode that maps to a user statement
                m_nextStatementBoundary = m_startLocation + data.bytecodeBegin;
                retStatement = m_statementIndex;
            }
            else if (m_fullstatementMap && m_statementIndex < m_fullstatementMap->Count())
            {
                FunctionBody::StatementMap *nextMap = Js::FunctionBody::GetNextNonSubexpressionStatementMap(m_fullstatementMap, m_statementIndex);
                if (!nextMap)
                {
                    // set to a location that will never match
                    m_nextStatementBoundary = m_startLocation - 1;
                }
                else
                {
                    // Start a range of bytecode that maps to a user statement
                    m_nextStatementBoundary = m_startLocation + m_fullstatementMap->Item(m_statementIndex)->byteCodeSpan.begin;
                    retStatement = m_statementIndex;
                }
            }
            else
            {
                // The remaining bytecode instructions do not map to a user statement, set a statementBoundary that cannot match
                m_nextStatementBoundary = m_startLocation - 1;
            }
        }

        return retStatement;
    }